

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall
IMLE<1,_1,_FastLinearExpert>::clusterForwardSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int newSol1,int newSol2,int worseSol)

{
  uint uVar1;
  pointer *ppMVar2;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> PVar3;
  double dVar4;
  pointer pMVar5;
  pointer pFVar6;
  double *pdVar7;
  iterator __position;
  undefined1 auVar8 [16];
  long lVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  undefined4 in_register_00000034;
  long lVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  double *pdVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Mat p;
  Mat sol;
  ArrayX sumInvRxj;
  ArrayX sumInvRj;
  undefined1 local_e8 [16];
  long local_d8;
  Mat *local_d0;
  undefined1 local_c8 [16];
  Index local_b8;
  Mat *local_a8;
  undefined8 uStack_a0;
  plain_array<double,_1,_0,_0> local_90;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_88;
  ulong local_70;
  double *local_68;
  double *local_60;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  local_58;
  
  local_e8 = (undefined1  [16])0x0;
  local_d8 = 0;
  lVar14 = (long)this->M;
  lVar12 = (long)this->nSolFound;
  if ((lVar12 != 0 && lVar14 != 0) &&
     (auVar8 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar8 / SEXT816(lVar12),0) < lVar14)) {
    puVar10 = (undefined8 *)
              __cxa_allocate_exception
                        (8,CONCAT44(in_register_00000034,newSol1),SUB168(auVar8 % SEXT816(lVar12),0)
                        );
    *puVar10 = operator_delete;
    __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_e8,lVar12 * lVar14,lVar14,lVar12);
  local_c8 = (undefined1  [16])0x0;
  local_b8 = 0;
  lVar12 = (long)this->nSolFound;
  if ((lVar12 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar12),0) < 1)) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = operator_delete;
    __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_c8,lVar12,1,lVar12);
  auVar25 = _DAT_001680b0;
  auVar8 = _DAT_001680a0;
  uVar1 = this->nSolFound - 1;
  if (1 < this->nSolFound) {
    pMVar5 = (this->predictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = local_c8._8_8_ + -1;
    auVar21._8_4_ = (int)lVar12;
    auVar21._0_8_ = lVar12;
    auVar21._12_4_ = (int)((ulong)lVar12 >> 0x20);
    pdVar15 = (double *)(local_c8._0_8_ + 8);
    uVar17 = 0;
    auVar21 = auVar21 ^ _DAT_001680b0;
    do {
      if (0 < (long)local_c8._8_8_) {
        PVar3.m_storage.m_data.array[0] =
             pMVar5[uVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
        uVar18 = 0;
        auVar26 = auVar8;
        do {
          auVar27 = auVar26 ^ auVar25;
          if ((bool)(~(auVar21._4_4_ < auVar27._4_4_ ||
                      auVar21._0_4_ < auVar27._0_4_ && auVar27._4_4_ == auVar21._4_4_) & 1)) {
            pdVar15[uVar18 - 1] = (double)PVar3.m_storage.m_data.array[0];
          }
          if (auVar27._12_4_ <= auVar21._12_4_ &&
              (auVar27._8_4_ <= auVar21._8_4_ || auVar27._12_4_ != auVar21._12_4_)) {
            pdVar15[uVar18] = (double)PVar3.m_storage.m_data.array[0];
          }
          uVar18 = uVar18 + 2;
          lVar12 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 2;
          auVar26._8_8_ = lVar12 + 2;
        } while ((local_c8._8_8_ + 1 & 0xfffffffffffffffe) != uVar18);
      }
      uVar17 = uVar17 + 1;
      pdVar15 = pdVar15 + local_c8._8_8_;
    } while (uVar17 != uVar1);
  }
  auVar25 = _DAT_001682d0;
  auVar8 = _DAT_001680b0;
  if (0 < (long)local_c8._8_8_) {
    pFVar6 = (this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    PVar3.m_storage.m_data.array[0] =
         pFVar6[newSol1].super_LinearExpert<1,_1>.pred_x.
         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
    uVar17 = local_c8._8_8_ + 1 & 0xfffffffffffffffe;
    lVar12 = local_c8._8_8_ + -1;
    auVar22._8_4_ = (int)lVar12;
    auVar22._0_8_ = lVar12;
    auVar22._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar18 = 0;
    auVar22 = auVar22 ^ _DAT_001680b0;
    auVar27 = _DAT_001680a0;
    do {
      auVar21 = auVar27 ^ auVar8;
      iVar20 = auVar22._4_4_;
      iVar23 = auVar22._12_4_;
      if ((bool)(~(auVar21._4_4_ == iVar20 && auVar22._0_4_ < auVar21._0_4_ ||
                  iVar20 < auVar21._4_4_) & 1)) {
        *(DenseStorage<double,_1,_1,_1,_0> *)
         (local_c8._0_8_ + ((long)worseSol * local_c8._8_8_ + uVar18) * 8) =
             PVar3.m_storage.m_data.array[0];
      }
      if ((auVar21._12_4_ != iVar23 || auVar21._8_4_ <= auVar22._8_4_) && auVar21._12_4_ <= iVar23)
      {
        *(DenseStorage<double,_1,_1,_1,_0> *)
         (local_c8._0_8_ + ((long)worseSol * local_c8._8_8_ + uVar18 + 1) * 8) =
             PVar3.m_storage.m_data.array[0];
      }
      uVar18 = uVar18 + 2;
      lVar12 = auVar25._0_8_;
      lVar9 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + lVar12;
      lVar14 = auVar25._8_8_;
      auVar27._8_8_ = lVar9 + lVar14;
    } while (uVar17 != uVar18);
    PVar3.m_storage.m_data.array[0] =
         pFVar6[newSol2].super_LinearExpert<1,_1>.pred_x.
         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage;
    lVar9 = local_c8._8_8_ * (long)(int)uVar1;
    uVar18 = 0;
    auVar25 = _DAT_001680a0;
    do {
      auVar21 = auVar25 ^ auVar8;
      if ((bool)(~(auVar21._4_4_ == iVar20 && auVar22._0_4_ < auVar21._0_4_ ||
                  iVar20 < auVar21._4_4_) & 1)) {
        *(DenseStorage<double,_1,_1,_1,_0> *)(local_c8._0_8_ + (lVar9 + uVar18) * 8) =
             PVar3.m_storage.m_data.array[0];
      }
      if ((auVar21._12_4_ != iVar23 || auVar21._8_4_ <= auVar22._8_4_) && auVar21._12_4_ <= iVar23)
      {
        *(DenseStorage<double,_1,_1,_1,_0> *)(local_c8._0_8_ + (lVar9 + uVar18 + 1) * 8) =
             PVar3.m_storage.m_data.array[0];
      }
      uVar18 = uVar18 + 2;
      lVar11 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + lVar12;
      auVar25._8_8_ = lVar11 + lVar14;
    } while (uVar17 != uVar18);
  }
  if (0 < (this->param).iterMax) {
    local_a8 = &this->fInvRj;
    local_d0 = &this->invRxj;
    iVar20 = 0;
    do {
      if (0 < this->M) {
        lVar12 = 0;
        lVar14 = 0;
        do {
          if (0 < this->nSolFound) {
            lVar9 = 0;
            do {
              dVar24 = (double)(this->experts).
                               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               .
                               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar14].
                               super_LinearExpert<1,_1>.pred_x.
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                               m_storage - *(double *)(local_c8._0_8_ + local_c8._8_8_ * lVar9 * 8);
              dVar24 = exp((this->fInvRj).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data
                           [(this->fInvRj).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows * lVar14] * dVar24 * dVar24 * -0.5);
              *(double *)(local_e8._0_8_ + (local_e8._8_8_ * lVar9 + lVar14) * 8) = dVar24;
              lVar9 = lVar9 + 1;
            } while (lVar9 < this->nSolFound);
          }
          if (local_d8 != 0) {
            dVar24 = *(double *)(local_e8._0_8_ + lVar14 * 8);
            if (1 < local_d8) {
              lVar9 = local_d8 + -1;
              pdVar15 = (double *)(lVar12 + local_e8._8_8_ * 8 + local_e8._0_8_);
              do {
                dVar24 = dVar24 + *pdVar15;
                pdVar15 = pdVar15 + local_e8._8_8_;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
            if (0 < local_d8 && 0.0 < dVar24) {
              pdVar15 = (double *)(local_e8._0_8_ + lVar12);
              lVar9 = local_d8;
              do {
                *pdVar15 = *pdVar15 / dVar24;
                pdVar15 = pdVar15 + local_e8._8_8_;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
          }
          lVar14 = lVar14 + 1;
          lVar12 = lVar12 + 8;
        } while (lVar14 < this->M);
      }
      local_58.m_lhs.m_lhs = local_d0;
      local_58.m_rhs.m_lhs = local_a8;
      local_58.m_lhs.m_rhs = (RhsNested)local_e8;
      local_58.m_rhs.m_rhs = (RhsNested)local_e8;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_c8,&local_58,
                 (assign_op<double,_double> *)&local_88);
      iVar20 = iVar20 + 1;
    } while (iVar20 < (this->param).iterMax);
  }
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            *)&local_58,(long)this->nSolFound,&this->zeroX,(allocator_type *)&local_88);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_88,(long)this->nSolFound,&this->zeroX,(allocator_type *)&local_90);
  iVar20 = this->nSolFound;
  uVar17 = (ulong)iVar20;
  pdVar15 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != uVar17) {
    free(pdVar15);
    if (iVar20 < 1) {
      pdVar15 = (double *)0x0;
    }
    else {
      pdVar15 = (double *)malloc(uVar17 * 8);
      if (pdVar15 == (double *)0x0) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar10 = operator_delete;
        __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar15;
  }
  (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       uVar17;
  if (0 < iVar20) {
    memset(pdVar15,0,uVar17 * 8);
  }
  if (0 < this->M) {
    pFVar6 = (this->experts).
             super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             .
             super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d0 = (Mat *)(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    local_60 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
    lVar12 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    pdVar7 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    lVar14 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar9 = 0;
    local_68 = (double *)local_e8._0_8_;
    pdVar16 = (double *)(local_e8._0_8_ + local_e8._8_8_ * 8);
    do {
      iVar20 = -(uint)(local_d8 == 0);
      if (1 < local_d8) {
        dVar24 = *(double *)(local_e8._0_8_ + lVar9 * 8);
        lVar13 = 1;
        lVar11 = 0;
        pdVar19 = pdVar16;
        do {
          dVar4 = *pdVar19;
          if (dVar24 < dVar4) {
            lVar11 = lVar13;
          }
          iVar20 = (int)lVar11;
          if (dVar4 <= dVar24) {
            dVar4 = dVar24;
          }
          dVar24 = dVar4;
          lVar13 = lVar13 + 1;
          pdVar19 = pdVar19 + local_e8._8_8_;
        } while (local_d8 != lVar13);
      }
      *(int *)((long)&(local_d0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data + lVar9 * 4) = iVar20;
      pdVar15[iVar20] = pFVar6[lVar9].super_LinearExpert<1,_1>.p_z_T + pdVar15[iVar20];
      (&((local_58.m_lhs.m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_data)[iVar20] =
           (double *)
           (local_60[lVar12 * lVar9] +
           (double)(&((local_58.m_lhs.m_lhs)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_data)[iVar20]);
      local_88.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar20].
      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
           pdVar7[lVar14 * lVar9] +
           local_88.
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar20].
           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
      lVar9 = lVar9 + 1;
      pdVar16 = pdVar16 + 1;
    } while (lVar9 < this->M);
  }
  local_a8 = (Mat *)this->pNoiseModelZ;
  uStack_a0 = 0;
  local_70 = uVar17;
  if ((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar17) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar17,1
              );
    uVar17 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  }
  pdVar16 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar18 = uVar17 - ((long)uVar17 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar17) {
    lVar12 = 0;
    do {
      dVar24 = (pdVar15 + lVar12)[1];
      pdVar7 = pdVar16 + lVar12;
      *pdVar7 = pdVar15[lVar12] + (double)local_a8;
      pdVar7[1] = dVar24 + (double)local_a8;
      lVar12 = lVar12 + 2;
    } while (lVar12 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar17) {
    do {
      pdVar16[uVar18] = pdVar15[uVar18] + (double)local_a8;
      uVar18 = uVar18 + 1;
    } while (uVar17 != uVar18);
  }
  pMVar5 = (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictions).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
    (this->predictions).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar5;
  }
  if (0 < this->nSolFound) {
    lVar12 = 0;
    do {
      local_90.array[0] =
           (double  [1])
           (local_88.
            super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar12].
            super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] /
           (double)(&((local_58.m_lhs.m_lhs)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_data)[lVar12]);
      __position._M_current =
           (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->predictions).
          super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          .
          super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::_M_realloc_insert(&(this->predictions).
                             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                            ,__position,(value_type *)&local_90);
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
        m_storage.m_data.array[0] = (double)local_90.array[0];
        ppMVar2 = &(this->predictions).
                   super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   .
                   super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar2 = *ppMVar2 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->nSolFound);
  }
  if (local_88.
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_88.
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.m_lhs.m_lhs != (Mat *)0x0) {
    free(local_58.m_lhs.m_lhs);
  }
  free((void *)local_c8._0_8_);
  free((void *)local_e8._0_8_);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterForwardSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nSolFound);
    Mat sol(D,nSolFound);

    // "Educated" guesses for the nSolFound solutions
    for(int k = 0; k < nSolFound-1; k++)
        sol.col(k) = predictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredX();
    sol.col(nSolFound-1) = experts[newSol2].getPredX();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nSolFound; k++ )
            {
                X dist = experts[j].getPredX() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(fInvRj.col(j).asDiagonal()*dist));
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;
        }
        // M-Step
        sol = (invRxj * p).cwiseQuotient( fInvRj * p );
        /* Here I can easily implement k-means by hard assigning to most probable solution */
    }


    /***** Recalculate (hard-assign) solutions   ******/
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    sum_p_z.setZero(nSolFound);

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
    {
        p.row(j).maxCoeff(&sNearest[j]);

        sum_p_z(sNearest[j]) += experts[j].get_p_z();
        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }
    sumW = sum_p_z.array() + pNoiseModelZ;

    // Clear predict data structure
    predictions.clear();

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
        predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
}